

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,
          CreateMortonLeaf<4,_embree::InstanceArrayPrimitive> *this,range<unsigned_int> *current,
          CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  float *pfVar2;
  pointer *pppTVar3;
  uint uVar4;
  uint uVar5;
  RTCFormat RVar6;
  uint uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *this_01;
  iterator __position;
  InstanceArray *pIVar9;
  RawBufferView *pRVar10;
  char *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  range<unsigned_int> *prVar19;
  NodeRecord *pNVar20;
  char *pcVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  Accel *pAVar26;
  long lVar27;
  undefined1 auVar28 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  float fVar32;
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  undefined1 in_XMM6 [16];
  float fVar46;
  float fVar47;
  undefined1 in_XMM7 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar57;
  float fVar59;
  undefined1 auVar55 [16];
  float fVar58;
  float fVar60;
  undefined1 auVar56 [16];
  float fVar61;
  float fVar64;
  float fVar66;
  undefined1 auVar62 [16];
  float fVar65;
  float fVar67;
  undefined1 auVar63 [16];
  float fVar68;
  float in_XMM12_Da;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float in_XMM14_Da;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  float in_XMM14_Dd;
  float in_XMM15_Da;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  MutexSys *local_f0;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  MutexSys *local_c8;
  char local_c0;
  ulong local_b8;
  ThreadLocal2 *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ThreadLocal2 *local_88;
  char local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 auVar30 [16];
  
  uVar4 = current->_begin;
  uVar5 = current->_end;
  local_b8 = (ulong)(uVar5 - uVar4);
  local_f0 = (MutexSys *)(local_b8 * 8);
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  this_01 = pTVar8->parent;
  local_e8 = current;
  local_d8 = __return_storage_ptr__;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_80 = '\x01';
    local_88 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_c8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_c0 = '\x01';
    local_b0 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_b0);
    }
    else {
      *__position._M_current = local_b0;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if (local_c0 == '\x01') {
      MutexSys::unlock(local_c8);
    }
    if (local_80 == '\x01') {
      MutexSys::unlock(&local_88->mutex);
    }
  }
  pTVar8->bytesUsed = (long)&local_f0->mutex + pTVar8->bytesUsed;
  sVar23 = pTVar8->cur;
  uVar24 = (ulong)(-(int)sVar23 & 0xf);
  uVar22 = (long)&local_f0->mutex + uVar24 + sVar23;
  pTVar8->cur = uVar22;
  if (pTVar8->end < uVar22) {
    pTVar8->cur = sVar23;
    if ((MutexSys *)pTVar8->allocBlockSize < (MutexSys *)((long)local_f0 << 2)) {
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_f0);
      fStack_d0 = in_XMM12_Dc;
      fStack_cc = in_XMM12_Dd;
      fStack_e0 = in_XMM14_Dc;
      fStack_dc = in_XMM14_Dd;
    }
    else {
      local_c8 = (MutexSys *)pTVar8->allocBlockSize;
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c8);
      pTVar8->ptr = pcVar21;
      sVar23 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar23;
      pTVar8->cur = 0;
      pTVar8->end = (size_t)local_c8;
      pTVar8->cur = (size_t)local_f0;
      if (local_c8 < local_f0) {
        pTVar8->cur = 0;
        local_c8 = (MutexSys *)pTVar8->allocBlockSize;
        pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c8);
        pTVar8->ptr = pcVar21;
        sVar23 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar23;
        pTVar8->cur = 0;
        pTVar8->end = (size_t)local_c8;
        pTVar8->cur = (size_t)local_f0;
        if (local_c8 < local_f0) {
          pTVar8->cur = 0;
          pcVar21 = (char *)0x0;
          fStack_d0 = in_XMM12_Dc;
          fStack_cc = in_XMM12_Dd;
          fStack_e0 = in_XMM14_Dc;
          fStack_dc = in_XMM14_Dd;
          goto LAB_00cd7712;
        }
      }
      pTVar8->bytesWasted = sVar23;
      fStack_d0 = in_XMM12_Dc;
      fStack_cc = in_XMM12_Dd;
      fStack_e0 = in_XMM14_Dc;
      fStack_dc = in_XMM14_Dd;
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar24;
    pcVar21 = pTVar8->ptr + (uVar22 - (long)local_f0);
    fStack_d0 = in_XMM12_Dc;
    fStack_cc = in_XMM12_Dd;
    fStack_e0 = in_XMM14_Dc;
    fStack_dc = in_XMM14_Dd;
  }
LAB_00cd7712:
  pNVar20 = local_d8;
  prVar19 = local_e8;
  aVar31 = _DAT_01feba00;
  if (uVar5 == uVar4) {
    auVar28 = DAT_01feb9f0._0_12_;
  }
  else {
    pIVar9 = this->mesh;
    lVar25 = 0;
    auVar30 = _DAT_01feb9f0;
    local_d8._0_4_ = in_XMM12_Da;
    local_d8._4_4_ = in_XMM12_Db;
    local_e8._0_4_ = in_XMM14_Da;
    local_e8._4_4_ = in_XMM14_Db;
    do {
      uVar5 = this->morton[(ulong)uVar4 + lVar25].field_0.field_0.index;
      uVar22 = (ulong)uVar5;
      pAVar26 = *(Accel **)&(pIVar9->super_Geometry).field_0x58;
      if ((pAVar26 != (Accel *)0x0) ||
         (*(int *)((pIVar9->object_ids).super_RawBufferView.ptr_ofs +
                  (pIVar9->object_ids).super_RawBufferView.stride * uVar22) != -1)) {
        if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
          pRVar10 = (pIVar9->l2w_buf).items;
          RVar6 = pRVar10->format;
          fVar54 = fStack_a4;
          if ((int)RVar6 < 0x9244) {
            if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar27 = pRVar10->stride * uVar22;
              fStack_94 = *(float *)(pcVar11 + lVar27 + 0x10);
              local_98 = *(float *)(pcVar11 + lVar27);
              local_68 = *(float *)(pcVar11 + lVar27 + 4);
              local_a8 = *(float *)(pcVar11 + lVar27 + 8);
              local_78 = *(float *)(pcVar11 + lVar27 + 0xc);
              fStack_90 = *(float *)(pcVar11 + lVar27 + 0x20);
              fStack_8c = 0.0;
              fStack_64 = *(float *)(pcVar11 + lVar27 + 0x14);
              fStack_60 = *(float *)(pcVar11 + lVar27 + 0x24);
              fStack_5c = 0.0;
              fStack_a0 = *(float *)(pcVar11 + lVar27 + 0x28);
              fStack_9c = 0.0;
              fStack_74 = *(float *)(pcVar11 + lVar27 + 0x1c);
              fStack_70 = *(float *)(pcVar11 + lVar27 + 0x2c);
              fStack_6c = 0.0;
              fVar54 = *(float *)(pcVar11 + lVar27 + 0x18);
            }
            else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar27 = pRVar10->stride * uVar22;
              local_98 = *(float *)(pcVar11 + lVar27);
              fStack_94 = (float)*(undefined8 *)(pcVar11 + lVar27 + 4);
              fStack_90 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 4) >> 0x20);
              fStack_8c = 0.0;
              local_68 = *(float *)(pcVar11 + lVar27 + 0xc);
              fStack_64 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x10);
              fStack_60 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x10) >> 0x20);
              fStack_5c = 0.0;
              local_a8 = *(float *)(pcVar11 + lVar27 + 0x18);
              fStack_a0 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x1c) >> 0x20);
              fStack_9c = 0.0;
              local_78 = *(float *)(pcVar11 + lVar27 + 0x24);
              fStack_74 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x28);
              fStack_70 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x28) >> 0x20);
              fStack_6c = 0.0;
              fVar54 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x1c);
            }
          }
          else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar27 = pRVar10->stride * uVar22;
            local_a8 = *(float *)(pcVar11 + lVar27 + 0x10);
            fVar54 = *(float *)((long)(pcVar11 + lVar27 + 0x10) + 4);
            local_98 = *(float *)(pcVar11 + lVar27);
            fStack_64 = *(float *)(pcVar11 + lVar27 + 4);
            fStack_a0 = *(float *)(pcVar11 + lVar27 + 8);
            local_68 = *(float *)(pcVar11 + lVar27 + 0xc);
            fStack_94 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x34);
            local_78 = *(float *)(pcVar11 + lVar27 + 0x18);
            fStack_74 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x1c);
            fStack_70 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x1c) >> 0x20);
            fVar33 = *(float *)(pcVar11 + lVar27 + 0x24);
            fStack_8c = *(float *)(pcVar11 + lVar27 + 0x28);
            fVar32 = *(float *)(pcVar11 + lVar27 + 0x2c);
            fVar47 = *(float *)(pcVar11 + lVar27 + 0x30);
            fVar49 = fVar47 * fVar47 + fVar32 * fVar32 + fVar33 * fVar33 + fStack_8c * fStack_8c;
            auVar62 = rsqrtss(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49));
            fVar45 = auVar62._0_4_;
            fStack_9c = fVar45 * fVar45 * fVar49 * -0.5 * fVar45 + fVar45 * 1.5;
            fStack_6c = fVar33 * fStack_9c;
            fStack_8c = fStack_8c * fStack_9c;
            fStack_5c = fVar32 * fStack_9c;
            fStack_9c = fStack_9c * fVar47;
            fStack_a4 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x34) >> 0x20);
            fStack_60 = *(float *)(pcVar11 + lVar27 + 0x3c);
            fStack_90 = fStack_a4;
          }
          else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar27 = pRVar10->stride * uVar22;
            pfVar2 = (float *)(pcVar11 + lVar27);
            local_98 = *pfVar2;
            fStack_94 = pfVar2[1];
            fStack_90 = pfVar2[2];
            fStack_8c = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar27 + 0x10);
            local_68 = *pfVar2;
            fStack_64 = pfVar2[1];
            fStack_60 = pfVar2[2];
            fStack_5c = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar27 + 0x20);
            local_a8 = *pfVar2;
            fVar54 = pfVar2[1];
            fStack_a0 = pfVar2[2];
            fStack_9c = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar27 + 0x30);
            local_78 = *pfVar2;
            fStack_74 = pfVar2[1];
            fStack_70 = pfVar2[2];
            fStack_6c = pfVar2[3];
          }
          _local_a8 = CONCAT44(fVar54,local_a8);
          fVar49 = fStack_8c * fStack_5c + fStack_9c * fStack_6c;
          fVar35 = fStack_8c * fStack_5c - fStack_9c * fStack_6c;
          fVar47 = fStack_6c * fStack_6c + fStack_8c * fStack_8c + -fStack_5c * fStack_5c +
                   -fStack_9c * fStack_9c;
          fVar45 = fStack_6c * fStack_6c - fStack_8c * fStack_8c;
          fVar33 = fStack_5c * fStack_5c + fVar45 + -fStack_9c * fStack_9c;
          fVar46 = fStack_8c * fStack_9c - fStack_5c * fStack_6c;
          fVar59 = fStack_5c * fStack_6c + fStack_8c * fStack_9c;
          fVar32 = fStack_5c * fStack_9c + fStack_8c * fStack_6c;
          fVar58 = fStack_5c * fStack_9c - fStack_8c * fStack_6c;
          fVar68 = fStack_9c * fStack_9c + fVar45 + -fStack_5c * fStack_5c;
          fVar49 = fVar49 + fVar49;
          fVar46 = fVar46 + fVar46;
          fVar35 = fVar35 + fVar35;
          fVar32 = fVar32 + fVar32;
          fVar59 = fVar59 + fVar59;
          fVar58 = fVar58 + fVar58;
          fVar45 = fVar47 * 1.0 + fVar49 * 0.0 + fVar46 * 0.0;
          fVar43 = fVar47 * 0.0 + fVar49 * 1.0 + fVar46 * 0.0;
          fVar38 = fVar47 * 0.0 + fVar49 * 0.0 + fVar46 * 1.0;
          fVar40 = fVar47 * 0.0 + fVar49 * 0.0 + fVar46 * 0.0;
          fVar50 = fVar35 * 1.0 + fVar33 * 0.0 + fVar32 * 0.0;
          fVar51 = fVar35 * 0.0 + fVar33 * 1.0 + fVar32 * 0.0;
          fVar52 = fVar35 * 0.0 + fVar33 * 0.0 + fVar32 * 1.0;
          fVar53 = fVar35 * 0.0 + fVar33 * 0.0 + fVar32 * 0.0;
          fVar39 = fVar59 * 1.0 + fVar58 * 0.0 + fVar68 * 0.0;
          fVar41 = fVar59 * 0.0 + fVar58 * 1.0 + fVar68 * 0.0;
          fVar42 = fVar59 * 0.0 + fVar58 * 0.0 + fVar68 * 1.0;
          fVar44 = fVar59 * 0.0 + fVar58 * 0.0 + fVar68 * 0.0;
          fVar47 = local_68 * fVar45 + fStack_64 * fVar50 + fVar39 * 0.0;
          fVar33 = local_68 * fVar43 + fStack_64 * fVar51 + fVar41 * 0.0;
          fVar68 = local_68 * fVar38 + fStack_64 * fVar52 + fVar42 * 0.0;
          fVar46 = local_68 * fVar40 + fStack_64 * fVar53 + fVar44 * 0.0;
          fVar35 = local_a8 * fVar45 + fVar54 * fVar50 + fStack_a0 * fVar39;
          fVar36 = local_a8 * fVar43 + fVar54 * fVar51 + fStack_a0 * fVar41;
          fVar32 = local_a8 * fVar38 + fVar54 * fVar52 + fStack_a0 * fVar42;
          fVar37 = local_a8 * fVar40 + fVar54 * fVar53 + fStack_a0 * fVar44;
          fVar54 = local_98 * fVar45 + fVar50 * 0.0 + fVar39 * 0.0;
          fVar58 = local_98 * fVar43 + fVar51 * 0.0 + fVar41 * 0.0;
          fVar59 = local_98 * fVar38 + fVar52 * 0.0 + fVar42 * 0.0;
          fVar49 = local_98 * fVar40 + fVar53 * 0.0 + fVar44 * 0.0;
          fVar39 = local_78 * fVar45 + fStack_74 * fVar50 + fStack_70 * fVar39 + fStack_94 + 0.0;
          fVar41 = local_78 * fVar43 + fStack_74 * fVar51 + fStack_70 * fVar41 + fStack_90 + 0.0;
          fVar43 = local_78 * fVar38 + fStack_74 * fVar52 + fStack_70 * fVar42 + fStack_60 + 0.0;
          fVar45 = local_78 * fVar40 + fStack_74 * fVar53 + fStack_70 * fVar44 + 0.0;
        }
        else {
          pRVar10 = (pIVar9->l2w_buf).items;
          RVar6 = pRVar10->format;
          fVar47 = in_XMM15_Da;
          fVar33 = in_XMM15_Db;
          fVar68 = in_XMM15_Dc;
          fVar46 = in_XMM15_Dd;
          fVar35 = (float)local_e8;
          fVar36 = local_e8._4_4_;
          fVar32 = fStack_e0;
          fVar37 = fStack_dc;
          fVar54 = (float)local_d8;
          fVar58 = local_d8._4_4_;
          fVar59 = fStack_d0;
          fVar49 = fStack_cc;
          fVar39 = in_XMM4_Da;
          fVar41 = in_XMM4_Db;
          fVar43 = in_XMM4_Dc;
          fVar45 = in_XMM4_Dd;
          if ((int)RVar6 < 0x9244) {
            if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar27 = pRVar10->stride * uVar22;
              in_XMM4_Da = *(float *)(pcVar11 + lVar27 + 0xc);
              in_XMM4_Db = *(float *)(pcVar11 + lVar27 + 0x1c);
              fVar47 = *(float *)(pcVar11 + lVar27 + 4);
              fVar33 = *(float *)(pcVar11 + lVar27 + 0x14);
              fVar68 = *(float *)(pcVar11 + lVar27 + 0x24);
              fVar46 = 0.0;
              fVar35 = *(float *)(pcVar11 + lVar27 + 8);
              fVar36 = *(float *)(pcVar11 + lVar27 + 0x18);
              fVar32 = *(float *)(pcVar11 + lVar27 + 0x28);
              fVar37 = 0.0;
              fVar54 = *(float *)(pcVar11 + lVar27);
              fVar58 = *(float *)(pcVar11 + lVar27 + 0x10);
              fVar59 = *(float *)(pcVar11 + lVar27 + 0x20);
              fVar49 = 0.0;
              fVar39 = in_XMM4_Da;
              fVar41 = in_XMM4_Db;
              fVar43 = *(float *)(pcVar11 + lVar27 + 0x2c);
              fVar45 = 0.0;
              in_XMM15_Da = *(float *)(pcVar11 + lVar27 + 4);
              in_XMM15_Db = *(float *)(pcVar11 + lVar27 + 0x14);
              in_XMM15_Dc = *(float *)(pcVar11 + lVar27 + 0x24);
              in_XMM15_Dd = 0.0;
              in_XMM4_Dc = *(float *)(pcVar11 + lVar27 + 0x2c);
              in_XMM4_Dd = 0.0;
              fStack_e0 = *(float *)(pcVar11 + lVar27 + 0x28);
              fStack_dc = 0.0;
              fStack_d0 = *(float *)(pcVar11 + lVar27 + 0x20);
              fStack_cc = 0.0;
              local_d8._0_4_ = *(float *)(pcVar11 + lVar27);
              local_d8._4_4_ = *(float *)(pcVar11 + lVar27 + 0x10);
              local_e8._0_4_ = *(float *)(pcVar11 + lVar27 + 8);
              local_e8._4_4_ = *(float *)(pcVar11 + lVar27 + 0x18);
            }
            else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar27 = pRVar10->stride * uVar22;
              fVar58 = (float)*(undefined8 *)(pcVar11 + lVar27 + 4);
              fVar59 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 4) >> 0x20);
              fVar36 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x1c);
              fVar32 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x1c) >> 0x20);
              in_XMM4_Db = *(float *)(pcVar11 + lVar27 + 0x30);
              in_XMM4_Da = *(float *)(pcVar11 + lVar27 + 0x24);
              fVar47 = *(float *)(pcVar11 + lVar27 + 0xc);
              fVar33 = *(float *)(pcVar11 + lVar27 + 0x18);
              fVar68 = *(float *)(pcVar11 + lVar27 + 0x1c);
              fVar46 = 0.0;
              fVar35 = *(float *)(pcVar11 + lVar27 + 0x18);
              fVar37 = 0.0;
              fVar54 = *(float *)(pcVar11 + lVar27);
              fVar49 = 0.0;
              fVar39 = in_XMM4_Da;
              fVar41 = in_XMM4_Db;
              fVar43 = *(float *)(pcVar11 + lVar27 + 0x34);
              fVar45 = 0.0;
              in_XMM15_Da = *(float *)(pcVar11 + lVar27 + 0xc);
              in_XMM15_Db = *(float *)(pcVar11 + lVar27 + 0x18);
              in_XMM15_Dc = *(float *)(pcVar11 + lVar27 + 0x1c);
              in_XMM15_Dd = 0.0;
              in_XMM4_Dc = *(float *)(pcVar11 + lVar27 + 0x34);
              in_XMM4_Dd = 0.0;
              fStack_e0 = fVar32;
              fStack_dc = 0.0;
              fStack_d0 = fVar59;
              fStack_cc = 0.0;
              local_d8._0_4_ = *(float *)(pcVar11 + lVar27);
              local_d8._4_4_ = fVar58;
              local_e8._0_4_ = *(float *)(pcVar11 + lVar27 + 0x18);
              local_e8._4_4_ = fVar36;
            }
          }
          else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar27 = pRVar10->stride * uVar22;
            fVar35 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x10);
            fVar36 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x10) >> 0x20);
            fVar54 = *(float *)(pcVar11 + lVar27);
            fVar33 = *(float *)(pcVar11 + lVar27 + 4);
            fVar32 = *(float *)(pcVar11 + lVar27 + 8);
            fVar47 = *(float *)(pcVar11 + lVar27 + 0xc);
            fVar58 = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x34);
            fVar59 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x34) >> 0x20);
            in_XMM4_Da = *(float *)(pcVar11 + lVar27 + 0x18);
            in_XMM4_Db = (float)*(undefined8 *)(pcVar11 + lVar27 + 0x1c);
            fVar43 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar27 + 0x1c) >> 0x20);
            fVar45 = *(float *)(pcVar11 + lVar27 + 0x24);
            fVar49 = *(float *)(pcVar11 + lVar27 + 0x28);
            fVar46 = *(float *)(pcVar11 + lVar27 + 0x2c);
            fVar68 = *(float *)(pcVar11 + lVar27 + 0x30);
            fVar39 = fVar68 * fVar68 + fVar46 * fVar46 + fVar45 * fVar45 + fVar49 * fVar49;
            auVar62 = rsqrtss(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39));
            fVar37 = auVar62._0_4_;
            fVar37 = fVar37 * fVar37 * fVar39 * -0.5 * fVar37 + fVar37 * 1.5;
            fVar45 = fVar45 * fVar37;
            fVar49 = fVar49 * fVar37;
            fVar46 = fVar46 * fVar37;
            fVar37 = fVar37 * fVar68;
            fVar68 = *(float *)(pcVar11 + lVar27 + 0x3c);
            fVar39 = in_XMM4_Da;
            fVar41 = in_XMM4_Db;
            in_XMM15_Da = fVar47;
            in_XMM15_Db = fVar33;
            in_XMM15_Dc = fVar68;
            in_XMM15_Dd = fVar46;
            in_XMM4_Dc = fVar43;
            in_XMM4_Dd = fVar45;
            fStack_e0 = fVar32;
            fStack_dc = fVar37;
            fStack_d0 = fVar59;
            fStack_cc = fVar49;
            local_d8._0_4_ = fVar54;
            local_d8._4_4_ = fVar58;
            local_e8._0_4_ = fVar35;
            local_e8._4_4_ = fVar36;
          }
          else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar27 = pRVar10->stride * uVar22;
            pfVar2 = (float *)(pcVar11 + lVar27);
            fVar54 = *pfVar2;
            fVar58 = pfVar2[1];
            fVar59 = pfVar2[2];
            fVar49 = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar27 + 0x10);
            fVar47 = *pfVar2;
            fVar33 = pfVar2[1];
            fVar68 = pfVar2[2];
            fVar46 = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar27 + 0x20);
            fVar35 = *pfVar2;
            fVar36 = pfVar2[1];
            fVar32 = pfVar2[2];
            fVar37 = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar27 + 0x30);
            in_XMM4_Da = *pfVar2;
            in_XMM4_Db = pfVar2[1];
            fVar43 = pfVar2[2];
            fVar45 = pfVar2[3];
            fVar39 = in_XMM4_Da;
            fVar41 = in_XMM4_Db;
            in_XMM15_Da = fVar47;
            in_XMM15_Db = fVar33;
            in_XMM15_Dc = fVar68;
            in_XMM15_Dd = fVar46;
            in_XMM4_Dc = fVar43;
            in_XMM4_Dd = fVar45;
            fStack_e0 = fVar32;
            fStack_dc = fVar37;
            fStack_d0 = fVar59;
            fStack_cc = fVar49;
            local_d8._0_4_ = fVar54;
            local_d8._4_4_ = fVar58;
            local_e8._0_4_ = fVar35;
            local_e8._4_4_ = fVar36;
          }
        }
        if (pAVar26 == (Accel *)0x0) {
          pAVar26 = pIVar9->objects
                    [*(uint *)((pIVar9->object_ids).super_RawBufferView.ptr_ofs +
                              (pIVar9->object_ids).super_RawBufferView.stride * uVar22)];
        }
        auVar62 = minps((undefined1  [16])(pAVar26->super_AccelData).bounds.bounds0.lower.field_0,
                        (undefined1  [16])(pAVar26->super_AccelData).bounds.bounds1.lower.field_0);
        auVar55 = maxps((undefined1  [16])(pAVar26->super_AccelData).bounds.bounds0.upper.field_0,
                        (undefined1  [16])(pAVar26->super_AccelData).bounds.bounds1.upper.field_0);
        fVar72 = auVar62._0_4_;
        fVar64 = auVar62._4_4_;
        fVar38 = auVar62._8_4_;
        fVar61 = fVar38 * fVar35 + fVar39;
        fVar65 = fVar38 * fVar36 + fVar41;
        fVar66 = fVar38 * fVar32 + fVar43;
        fVar67 = fVar38 * fVar37 + fVar45;
        fVar50 = fVar64 * fVar47 + fVar61;
        fVar51 = fVar64 * fVar33 + fVar65;
        fVar52 = fVar64 * fVar68 + fVar66;
        fVar53 = fVar64 * fVar46 + fVar67;
        fVar69 = fVar72 * fVar54;
        fVar70 = fVar72 * fVar58;
        fVar71 = fVar72 * fVar59;
        fVar72 = fVar72 * fVar49;
        fVar38 = fVar69 + fVar50;
        fVar40 = fVar70 + fVar51;
        fVar42 = fVar71 + fVar52;
        fVar44 = fVar72 + fVar53;
        auVar62._4_4_ = fVar40;
        auVar62._0_4_ = fVar38;
        auVar62._8_4_ = fVar42;
        auVar62._12_4_ = fVar44;
        auVar62 = minps(_DAT_01feb9f0,auVar62);
        auVar48._4_4_ = fVar40;
        auVar48._0_4_ = fVar38;
        auVar48._8_4_ = fVar42;
        auVar48._12_4_ = fVar44;
        auVar48 = maxps((undefined1  [16])_DAT_01feba00,auVar48);
        fVar60 = auVar55._0_4_;
        fVar57 = auVar55._4_4_;
        fVar38 = auVar55._8_4_;
        fVar39 = fVar38 * fVar35 + fVar39;
        fVar41 = fVar38 * fVar36 + fVar41;
        fVar43 = fVar38 * fVar32 + fVar43;
        fVar45 = fVar38 * fVar37 + fVar45;
        fVar32 = fVar64 * fVar47 + fVar39;
        fVar35 = fVar64 * fVar33 + fVar41;
        fVar36 = fVar64 * fVar68 + fVar43;
        fVar37 = fVar64 * fVar46 + fVar45;
        fVar38 = fVar69 + fVar32;
        fVar40 = fVar70 + fVar35;
        fVar42 = fVar71 + fVar36;
        fVar44 = fVar72 + fVar37;
        auVar15._4_4_ = fVar40;
        auVar15._0_4_ = fVar38;
        auVar15._8_4_ = fVar42;
        auVar15._12_4_ = fVar44;
        auVar62 = minps(auVar62,auVar15);
        auVar16._4_4_ = fVar40;
        auVar16._0_4_ = fVar38;
        auVar16._8_4_ = fVar42;
        auVar16._12_4_ = fVar44;
        auVar48 = maxps(auVar48,auVar16);
        fVar61 = fVar61 + fVar57 * fVar47;
        fVar65 = fVar65 + fVar57 * fVar33;
        fVar66 = fVar66 + fVar57 * fVar68;
        fVar67 = fVar67 + fVar57 * fVar46;
        fVar38 = fVar69 + fVar61;
        fVar40 = fVar70 + fVar65;
        fVar42 = fVar71 + fVar66;
        fVar44 = fVar72 + fVar67;
        auVar55._4_4_ = fVar40;
        auVar55._0_4_ = fVar38;
        auVar55._8_4_ = fVar42;
        auVar55._12_4_ = fVar44;
        auVar62 = minps(auVar62,auVar55);
        auVar12._4_4_ = fVar40;
        auVar12._0_4_ = fVar38;
        auVar12._8_4_ = fVar42;
        auVar12._12_4_ = fVar44;
        auVar48 = maxps(auVar48,auVar12);
        fVar39 = fVar57 * fVar47 + fVar39;
        fVar41 = fVar57 * fVar33 + fVar41;
        fVar43 = fVar57 * fVar68 + fVar43;
        fVar45 = fVar57 * fVar46 + fVar45;
        fVar69 = fVar69 + fVar39;
        fVar70 = fVar70 + fVar41;
        fVar71 = fVar71 + fVar43;
        fVar72 = fVar72 + fVar45;
        auVar17._4_4_ = fVar70;
        auVar17._0_4_ = fVar69;
        auVar17._8_4_ = fVar71;
        auVar17._12_4_ = fVar72;
        auVar62 = minps(auVar62,auVar17);
        auVar18._4_4_ = fVar70;
        auVar18._0_4_ = fVar69;
        auVar18._8_4_ = fVar71;
        auVar18._12_4_ = fVar72;
        auVar48 = maxps(auVar48,auVar18);
        fVar54 = fVar60 * fVar54;
        fVar58 = fVar60 * fVar58;
        fVar59 = fVar60 * fVar59;
        fVar60 = fVar60 * fVar49;
        fVar50 = fVar50 + fVar54;
        fVar51 = fVar51 + fVar58;
        fVar52 = fVar52 + fVar59;
        fVar53 = fVar53 + fVar60;
        auVar13._4_4_ = fVar51;
        auVar13._0_4_ = fVar50;
        auVar13._8_4_ = fVar52;
        auVar13._12_4_ = fVar53;
        auVar62 = minps(auVar62,auVar13);
        auVar14._4_4_ = fVar51;
        auVar14._0_4_ = fVar50;
        auVar14._8_4_ = fVar52;
        auVar14._12_4_ = fVar53;
        auVar48 = maxps(auVar48,auVar14);
        auVar34._0_4_ = fVar32 + fVar54;
        auVar34._4_4_ = fVar35 + fVar58;
        auVar34._8_4_ = fVar36 + fVar59;
        auVar34._12_4_ = fVar37 + fVar60;
        auVar62 = minps(auVar62,auVar34);
        auVar48 = maxps(auVar48,auVar34);
        auVar63._0_4_ = fVar61 + fVar54;
        auVar63._4_4_ = fVar65 + fVar58;
        auVar63._8_4_ = fVar66 + fVar59;
        auVar63._12_4_ = fVar67 + fVar60;
        auVar62 = minps(auVar62,auVar63);
        auVar48 = maxps(auVar48,auVar63);
        auVar56._0_4_ = fVar54 + fVar39;
        auVar56._4_4_ = fVar58 + fVar41;
        auVar56._8_4_ = fVar59 + fVar43;
        auVar56._12_4_ = fVar60 + fVar45;
        in_XMM6 = minps(auVar62,auVar56);
        in_XMM7 = maxps(auVar48,auVar56);
      }
      auVar30 = minps(auVar30,in_XMM6);
      auVar28 = auVar30._0_12_;
      aVar31.m128 = (__m128)maxps(aVar31.m128,in_XMM7);
      uVar7 = this->geomID_;
      *(uint *)(pcVar21 + lVar25 * 8) = uVar5;
      *(uint *)(pcVar21 + lVar25 * 8 + 4) = uVar7;
      lVar25 = lVar25 + 1;
    } while (local_b8 + (local_b8 == 0) != lVar25);
  }
  uVar22 = 7;
  if (local_b8 < 7) {
    uVar22 = local_b8;
  }
  aVar29.m128[3] = (float)(prVar19->_end - prVar19->_begin);
  aVar29._0_12_ = auVar28;
  (pNVar20->ref).ptr = uVar22 | (ulong)pcVar21 | 8;
  (pNVar20->bounds).lower.field_0 = aVar29;
  (pNVar20->bounds).upper.field_0 = aVar31;
  return pNVar20;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);

        /* allocate leaf node */
        InstanceArrayPrimitive* accel = (InstanceArrayPrimitive*) alloc.malloc1(items*sizeof(InstanceArrayPrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const InstanceArray* instance = this->mesh;

        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstanceArrayPrimitive(geomID_, primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }